

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomThreeAction::Pick(BlueRoomThreeAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  string *this_01;
  itemType local_54;
  string local_50;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BALL) {
    local_54 = BALL;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 == B_ROOM3) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_30,
                 "You pick up the weighty steel ball. It is no fanciful feat, but you feel accomplished none the less."
                 ,(allocator *)&local_54);
      ActionResults::ActionResults(pAVar3,CURRENT,&local_30);
      this_01 = &local_30;
      goto LAB_0012062d;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 != PIPE) {
    pAVar3 = AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
    return pAVar3;
  }
  pAVar3 = (ActionResults *)operator_new(0x30);
  std::__cxx11::string::string
            ((string *)&local_50,
             "You attempt to pry loose a section of pipe, but the metal is so cold that you can only hold on for a second. No pipe shall you hold today."
             ,(allocator *)&local_54);
  ActionResults::ActionResults(pAVar3,CURRENT,&local_50);
  this_01 = &local_50;
LAB_0012062d:
  std::__cxx11::string::~string((string *)this_01);
  return pAVar3;
}

Assistant:

ActionResults * BlueRoomThreeAction::Pick() {
    if(commands->getMainItem() == BALL && itemList->getValue(BALL)->getLocation() == B_ROOM3){
        return new ActionResults(CURRENT, "You pick up the weighty steel ball. It is no fanciful feat, but you feel accomplished none the less.");
    } else if(commands->getMainItem() == PIPE){
        return new ActionResults(CURRENT, "You attempt to pry loose a section of pipe, but the metal is so cold that you can only hold on for a second. No pipe shall you hold today.");
    } else {
        return AbstractRoomAction::Pick();
    }
}